

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O1

uint System::getProcessorCount(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  return (uint)lVar1;
}

Assistant:

uint System::getProcessorCount()
{
#ifdef _WIN32
  SYSTEM_INFO sysinfo;
  GetSystemInfo(&sysinfo);
  return sysinfo.dwNumberOfProcessors;
#else
  return sysconf(_SC_NPROCESSORS_ONLN);
#endif
}